

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void * hash_table_get_item(hash_table_t *table,void *key)

{
  size_t sVar1;
  int iVar2;
  size_t sVar3;
  hash_table_bucket_t *local_30;
  hash_table_bucket_t *b;
  uint i;
  void *key_local;
  hash_table_t *table_local;
  
  sVar1 = (table->ghash).mult;
  sVar3 = (*table->hash)(key);
  local_30 = table->buckets
             [sVar1 * sVar3 + (table->ghash).add >>
              (0x40U - (char)(table->ghash).log2_buckets & 0x3f) & 0xffffffff].next;
  while( true ) {
    if (local_30 == (hash_table_bucket_t *)0x0) {
      return (void *)0x0;
    }
    iVar2 = (*table->is_equal)(key,local_30->data);
    if (iVar2 != 0) break;
    local_30 = local_30->next;
  }
  return local_30->data;
}

Assistant:

void * hash_table_get_item( const hash_table_t * table, void * key )
{
    unsigned i = (unsigned) hash( table->ghash, (* table->hash )( key ) );
    const hash_table_bucket_t *b = table->buckets[i].next;

    while (b) {
        if ( (*table->is_equal)(key, b->data) )
            return b->data;
        b = b->next;
    }

    return NULL;
}